

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O0

void do_search(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CClass *this;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  int chance;
  OBJ_AFFECT_DATA *oaf;
  OBJ_DATA *obj;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  void *in_stack_ffffffffffffffe0;
  OBJ_AFFECT_DATA *arg1;
  CHAR_DATA *pCVar4;
  
  pCVar4 = (CHAR_DATA *)0x0;
  act((char *)in_RSI,(CHAR_DATA *)0x0,in_stack_ffffffffffffffe0,
      (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
  act((char *)in_RSI,pCVar4,in_stack_ffffffffffffffe0,
      (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
  iVar2 = number_percent();
  for (pCVar4 = (CHAR_DATA *)in_RDI->in_room->contents; pCVar4 != (CHAR_DATA *)0x0;
      pCVar4 = pCVar4->next_in_room) {
    bVar1 = is_affected_obj((OBJ_DATA *)pCVar4,(int)gsn_stash);
    if (bVar1) {
      for (arg1 = *(OBJ_AFFECT_DATA **)&pCVar4->tracktimer;
          (arg1 != (OBJ_AFFECT_DATA *)0x0 && (arg1->type != gsn_stash)); arg1 = arg1->next) {
        iVar2 = ((int)in_RDI->level - (int)arg1->level) + iVar2;
        this = char_data::Class(in_RSI);
        iVar3 = CClass::GetIndex(this);
        if (iVar3 == 2) {
          iVar2 = (int)in_RDI->level / 2 + iVar2;
        }
        if ((arg1->owner != in_RDI) && (iVar3 = number_percent(), iVar3 < iVar2)) {
          affect_strip_obj((OBJ_DATA *)in_RSI,(int)((ulong)pCVar4 >> 0x20));
          act((char *)in_RSI,pCVar4,arg1,(void *)CONCAT44(iVar2,in_stack_ffffffffffffffd8),0);
          act((char *)in_RSI,pCVar4,arg1,(void *)CONCAT44(iVar2,in_stack_ffffffffffffffd8),0);
        }
      }
    }
  }
  WAIT_STATE(in_RSI,0);
  return;
}

Assistant:

void do_search(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *obj = nullptr;
	OBJ_AFFECT_DATA *oaf;
	int chance;

	act("You intently scrutinize your surroundings...", ch, 0, 0, TO_CHAR);
	act("$n intently scrutinizes $s surroundings...", ch, 0, 0, TO_ROOM);

	chance = number_percent();

	for (obj = ch->in_room->contents; obj != nullptr; obj = obj->next_content)
	{
		if (is_affected_obj(obj, gsn_stash))
		{
			for (oaf = obj->affected; oaf != nullptr; oaf = oaf->next)
			{
				if (oaf->type == gsn_stash)
					break;

				chance += (ch->level - oaf->level);

				if (ch->Class()->GetIndex() == CLASS_THIEF)
					chance += (ch->level / 2);

				if (oaf->owner != ch && (number_percent() < chance))
				{
					affect_strip_obj(obj, gsn_stash);
					act("You stumble across $p which seemed to be hidden from your eye.", ch, obj, 0, TO_CHAR);
					act("$n stumbles across and reveals $p.", ch, obj, 0, TO_ROOM);
				}
			}
		}
	}

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}